

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnBrTableTarget(SharedValidator *this,Location *loc,Var *depth)

{
  size_t sVar1;
  undefined8 uVar2;
  Result RVar3;
  Result RVar4;
  char *pcVar5;
  
  sVar1 = (loc->filename)._M_len;
  pcVar5 = (loc->filename)._M_str;
  uVar2 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar2;
  (this->expr_loc_).filename._M_len = sVar1;
  (this->expr_loc_).filename._M_str = pcVar5;
  pcVar5 = Var::index(depth,(char *)loc,(int)depth);
  RVar3 = TypeChecker::OnBrTableTarget(&this->typechecker_,(Index)pcVar5);
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = RVar3.enum_ == Error;
  return (Result)RVar4.enum_;
}

Assistant:

Result SharedValidator::OnBrTableTarget(const Location& loc, Var depth) {
  Result result = Result::Ok;
  expr_loc_ = loc;
  result |= typechecker_.OnBrTableTarget(depth.index());
  return result;
}